

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void __thiscall Draw::PrintNumAlignCenter(Draw *this,int num,int w,bool Zero)

{
  int iVar1;
  undefined8 in_RAX;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 uStack_38;
  
  if (num == 0 && !Zero) {
    if (0 < w) {
      uStack_38 = in_RAX;
      do {
        uStack_38._0_2_ = CONCAT11(0x20,(undefined1)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)((long)&uStack_38 + 1),1);
        w = w + -1;
      } while (w != 0);
    }
  }
  else {
    iVar1 = 0;
    iVar4 = num;
    if (num != 0) {
      do {
        iVar1 = iVar1 + 1;
        uVar2 = iVar4 + 9;
        iVar4 = iVar4 / 10;
      } while (0x12 < uVar2);
    }
    iVar4 = 1;
    if (num != 0) {
      iVar4 = iVar1;
    }
    iVar1 = w - iVar4;
    if (w < iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      return;
    }
    uStack_38._0_4_ = (undefined4)in_RAX;
    uStack_38 = CONCAT44(num,(undefined4)uStack_38);
    iVar4 = iVar1 / 2;
    if (iVar4 < iVar1) {
      iVar3 = 0;
      do {
        uStack_38._0_3_ = CONCAT12(0x20,(undefined2)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)((long)&uStack_38 + 2),1);
        iVar3 = iVar3 + 1;
      } while (iVar3 < iVar1 - iVar4);
    }
    std::ostream::operator<<((ostream *)&std::cout,uStack_38._4_4_);
    if (1 < iVar1) {
      do {
        uStack_38._0_4_ = CONCAT13(0x20,(undefined3)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)((long)&uStack_38 + 3),1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  return;
}

Assistant:

void Draw::PrintNumAlignCenter(int num, int w, bool Zero) {
    if (num == 0 && !Zero) {
        for (int i = 0; i < w; i++)
            std::cout << ' ';
        return;
    }
    int len = 0, tnum = num;
    while (tnum) {
        tnum /= 10;
        len++;
    }
    if (num == 0)
        len = 1;
    if (w < len) {
        std::cout << "ERROR" << std::endl;
        return;
    }
    w -= len;
    for (int i = 0; i < w - w / 2; i++)
        std::cout << ' ';
    std::cout << num;
    for (int i = 0; i < w / 2; i++)
        std::cout << ' ';
}